

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyFreeStyles(TidyDocImpl *doc)

{
  TagStyle *pTVar1;
  TagStyle *pTVar2;
  
  if (doc->lexer != (Lexer *)0x0) {
    pTVar2 = doc->lexer->styles;
    while (pTVar2 != (TagStyle *)0x0) {
      pTVar1 = pTVar2->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pTVar2->tag);
      (*doc->allocator->vtbl->free)(doc->allocator,pTVar2->tag_class);
      (*doc->allocator->vtbl->free)(doc->allocator,pTVar2->properties);
      (*doc->allocator->vtbl->free)(doc->allocator,pTVar2);
      pTVar2 = pTVar1;
    }
  }
  return;
}

Assistant:

void TY_(FreeStyles)( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    if ( lexer )
    {
        TagStyle *style, *next;
        for ( style = lexer->styles; style; style = next )
        {
            next = style->next;
            TidyDocFree( doc, style->tag );
            TidyDocFree( doc, style->tag_class );
            TidyDocFree( doc, style->properties );
            TidyDocFree( doc, style );
        }
    }
}